

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_mt_test.c
# Opt level: O1

void * thread_output(void *arg)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  undefined8 uVar11;
  MppBufferGroup pvVar12;
  long lVar13;
  MppFrame frame;
  int local_154;
  RK_S32 temporal_id;
  undefined4 local_14c;
  long local_148;
  long local_140;
  char log_buf [256];
  
  local_140 = *arg;
  uVar1 = *(undefined8 *)((long)arg + 8);
  lVar13 = *(long *)((long)arg + 0x10);
  local_154 = *(int *)((long)arg + 0x68);
  local_148 = lVar13;
  if (local_154 == 0) {
    _mpp_log_l(4,"mpi_dec_mt_test","get frame thread start\n",0);
  }
  do {
    frame = (MppFrame)0x0;
    iVar3 = (**(code **)(lVar13 + 0x18))(uVar1,&frame);
    if (iVar3 == 0) {
      if (frame == (MppFrame)0x0) {
        usleep(1000);
        goto LAB_001049be;
      }
      iVar3 = mpp_frame_get_info_change();
      if (iVar3 == 0) {
        uVar7 = mpp_frame_get_errinfo(frame);
        uVar8 = mpp_frame_get_discard(frame);
        iVar3 = snprintf(log_buf,0xff,"decode get frame %d",(ulong)*(uint *)((long)arg + 0x58));
        iVar9 = mpp_frame_has_meta(frame);
        if (iVar9 != 0) {
          uVar11 = mpp_frame_get_meta(frame);
          temporal_id = 0;
          mpp_meta_get_s32(uVar11,0x746c6964,&temporal_id);
          iVar9 = snprintf(log_buf + iVar3,(long)(0xff - iVar3)," tid %d",(ulong)(uint)temporal_id);
          iVar3 = iVar3 + iVar9;
        }
        if (uVar7 != 0 || uVar8 != 0) {
          snprintf(log_buf + iVar3,(long)(0xff - iVar3)," err %x discard %x",(ulong)uVar7,
                   (ulong)uVar8);
        }
        if (local_154 == 0) {
          _mpp_log_l(4,"mpi_dec_mt_test","%p %s\n",0,uVar1,log_buf);
        }
        *(int *)((long)arg + 0x58) = *(int *)((long)arg + 0x58) + 1;
        if (*(FILE **)((long)arg + 0x50) != (FILE *)0x0 && uVar7 == 0) {
          dump_mpp_frame_to_file(frame,*(FILE **)((long)arg + 0x50));
        }
        fps_calc_inc(*(FpsCalc *)(local_140 + 0x248));
        lVar13 = local_148;
LAB_00104c78:
        iVar10 = mpp_frame_get_eos(frame);
        mpp_frame_deinit(&frame);
        iVar3 = *(int *)((long)arg + 0x5c);
        if (((0 < iVar3) && (iVar3 <= *(int *)((long)arg + 0x58))) ||
           ((iVar9 = 0, iVar3 == 0 && (iVar10 != 0)))) {
          *(undefined4 *)((long)arg + 0x18) = 1;
          iVar9 = 0;
        }
      }
      else {
        local_14c = mpp_frame_get_width(frame);
        uVar4 = mpp_frame_get_height(frame);
        uVar5 = mpp_frame_get_hor_stride(frame);
        uVar6 = mpp_frame_get_ver_stride(frame);
        uVar11 = mpp_frame_get_buf_size(frame);
        if (local_154 == 0) {
          _mpp_log_l(4,"mpi_dec_mt_test","decode_get_frame get info changed found\n",0);
          _mpp_log_l(4,"mpi_dec_mt_test",
                     "decoder require buffer w:h [%d:%d] stride [%d:%d] size %d\n",0,local_14c,uVar4
                     ,uVar5,uVar6,uVar11);
        }
        pvVar12 = dec_buf_mgr_setup(*(DecBufMgr *)((long)arg + 0x28),(RK_U32)uVar11,0x18,
                                    *(MppDecBufMode *)(local_140 + 0x230));
        lVar13 = local_148;
        iVar3 = (**(code **)(local_148 + 0x70))(uVar1,0x310002,pvVar12);
        if (iVar3 == 0) {
          *(MppBufferGroup *)((long)arg + 0x30) = pvVar12;
          iVar9 = 0;
          iVar3 = (**(code **)(lVar13 + 0x70))(uVar1,0x310003,0);
          if (iVar3 != 0) {
            _mpp_log_l(2,"mpi_dec_mt_test","info change ready failed ret %d\n",0,iVar3);
            goto LAB_00104c64;
          }
          bVar2 = true;
        }
        else {
          _mpp_log_l(2,"mpi_dec_mt_test","%p set buffer group failed ret %d\n",0,uVar1,iVar3);
LAB_00104c64:
          bVar2 = false;
          iVar9 = 4;
        }
        if (bVar2) goto LAB_00104c78;
      }
    }
    else {
      _mpp_log_l(2,"mpi_dec_mt_test","decode_get_frame failed ret %d\n",0,iVar3);
LAB_001049be:
      iVar9 = 5;
    }
    if ((iVar9 == 4) || (*(int *)((long)arg + 0x18) != 0)) {
      if (local_154 == 0) {
        _mpp_log_l(4,"mpi_dec_mt_test","get frame thread end\n",0);
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

void *thread_output(void *arg)
{
    MpiDecMtLoopData *data = (MpiDecMtLoopData *)arg;
    MpiDecTestCmd *cmd = data->cmd;
    MppCtx ctx  = data->ctx;
    MppApi *mpi = data->mpi;
    RK_U32 quiet = data->quiet;

    mpp_log_q(quiet, "get frame thread start\n");

    // then get all available frame and release
    do {
        RK_U32 frm_eos = 0;
        MppFrame frame = NULL;
        MPP_RET ret = mpi->decode_get_frame(ctx, &frame);

        if (ret) {
            mpp_err("decode_get_frame failed ret %d\n", ret);
            continue;
        }

        if (NULL == frame) {
            msleep(1);
            continue;
        }

        if (mpp_frame_get_info_change(frame)) {
            // found info change and create buffer group for decoding
            RK_U32 width = mpp_frame_get_width(frame);
            RK_U32 height = mpp_frame_get_height(frame);
            RK_U32 hor_stride = mpp_frame_get_hor_stride(frame);
            RK_U32 ver_stride = mpp_frame_get_ver_stride(frame);
            RK_U32 buf_size = mpp_frame_get_buf_size(frame);
            MppBufferGroup grp = NULL;

            mpp_log_q(quiet, "decode_get_frame get info changed found\n");
            mpp_log_q(quiet, "decoder require buffer w:h [%d:%d] stride [%d:%d] size %d\n",
                      width, height, hor_stride, ver_stride, buf_size);

            grp = dec_buf_mgr_setup(data->buf_mgr, buf_size, 24, cmd->buf_mode);
            /* Set buffer to mpp decoder */
            ret = mpi->control(ctx, MPP_DEC_SET_EXT_BUF_GROUP, grp);
            if (ret) {
                mpp_err("%p set buffer group failed ret %d\n", ctx, ret);
                break;
            }
            data->frm_grp = grp;

            ret = mpi->control(ctx, MPP_DEC_SET_INFO_CHANGE_READY, NULL);
            if (ret) {
                mpp_err("info change ready failed ret %d\n", ret);
                break;
            }
        } else {
            char log_buf[256];
            RK_S32 log_size = sizeof(log_buf) - 1;
            RK_S32 log_len = 0;
            RK_U32 err_info = mpp_frame_get_errinfo(frame);
            RK_U32 discard = mpp_frame_get_discard(frame);

            log_len += snprintf(log_buf + log_len, log_size - log_len,
                                "decode get frame %d", data->frame_count);

            if (mpp_frame_has_meta(frame)) {
                MppMeta meta = mpp_frame_get_meta(frame);
                RK_S32 temporal_id = 0;

                mpp_meta_get_s32(meta, KEY_TEMPORAL_ID, &temporal_id);

                log_len += snprintf(log_buf + log_len, log_size - log_len,
                                    " tid %d", temporal_id);
            }

            if (err_info || discard) {
                log_len += snprintf(log_buf + log_len, log_size - log_len,
                                    " err %x discard %x", err_info, discard);
            }
            mpp_log_q(quiet, "%p %s\n", ctx, log_buf);

            data->frame_count++;
            if (data->fp_output && !err_info)
                dump_mpp_frame_to_file(frame, data->fp_output);

            fps_calc_inc(cmd->fps);
        }

        frm_eos = mpp_frame_get_eos(frame);
        mpp_frame_deinit(&frame);

        if ((data->frame_num > 0 && (data->frame_count >= data->frame_num)) ||
            ((data->frame_num == 0) && frm_eos))
            data->loop_end = 1;
    } while (!data->loop_end);

    mpp_log_q(quiet, "get frame thread end\n");

    return NULL;
}